

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::calcNdf(SimInfo *this)

{
  pointer ppSVar1;
  bool bVar2;
  pointer ppSVar3;
  Molecule *pMVar4;
  StuntDouble *pSVar5;
  int iVar6;
  Atom *this_00;
  int iVar7;
  pointer ppAVar8;
  MoleculeIterator local_38;
  
  local_38._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar7 = 0;
  if ((_Rb_tree_header *)local_38._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar4 = (Molecule *)0x0;
  }
  else {
    pMVar4 = (Molecule *)local_38._M_node[1]._M_parent;
  }
  iVar6 = 0;
  while (pMVar4 != (Molecule *)0x0) {
    ppSVar3 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar3 != ppSVar1) goto LAB_00131c53;
    pSVar5 = (StuntDouble *)0x0;
    while (pSVar5 != (StuntDouble *)0x0) {
      if (pSVar5->objType_ - otDAtom < 2) {
        if (pSVar5->linear_ == true) {
          iVar7 = iVar7 + 5;
        }
        else {
          iVar7 = iVar7 + 6;
        }
      }
      else {
        iVar7 = iVar7 + 3;
      }
      ppSVar3 = ppSVar3 + 1;
      pSVar5 = (StuntDouble *)0x0;
      if (ppSVar3 != ppSVar1) {
LAB_00131c53:
        pSVar5 = *ppSVar3;
      }
    }
    ppAVar8 = (pMVar4->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar8 !=
        (pMVar4->fluctuatingCharges_).
        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00131c8b;
    this_00 = (Atom *)0x0;
    while (this_00 != (Atom *)0x0) {
      bVar2 = Atom::isFluctuatingCharge(this_00);
      iVar6 = iVar6 + (uint)bVar2;
      ppAVar8 = ppAVar8 + 1;
      this_00 = (Atom *)0x0;
      if (ppAVar8 !=
          (pMVar4->fluctuatingCharges_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00131c8b:
        this_00 = *ppAVar8;
      }
    }
    pMVar4 = nextMolecule(this,&local_38);
  }
  this->ndfLocal_ = iVar7;
  this->nGlobalFluctuatingCharges_ = iVar6;
  this->ndf_ = (iVar7 - (this->nConstraints_ + this->nZconstraint_)) + -3;
  return;
}

Assistant:

void SimInfo::calcNdf() {
    int ndf_local, nfq_local;
    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    vector<Atom*>::iterator k;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    ndf_local = 0;
    nfq_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndf_local += 2;
          } else {
            ndf_local += 3;
          }
        }
      }

      for (atom = mol->beginFluctuatingCharge(k); atom != NULL;
           atom = mol->nextFluctuatingCharge(k)) {
        if (atom->isFluctuatingCharge()) { nfq_local++; }
      }
    }

    ndfLocal_ = ndf_local;

    // n_constraints is local, so subtract them on each processor
    ndf_local -= nConstraints_;

#ifdef IS_MPI
    MPI_Allreduce(&ndf_local, &ndf_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(&nfq_local, &nGlobalFluctuatingCharges_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    ndf_                       = ndf_local;
    nGlobalFluctuatingCharges_ = nfq_local;
#endif

    // nZconstraints_ is global, as are the 3 COM translations for the
    // entire system:
    ndf_ = ndf_ - 3 - nZconstraint_;
  }